

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmrun.h
# Opt level: O0

void __thiscall CVmRun::push_string(CVmRun *this,char *str)

{
  CVmRun *in_RSI;
  size_t in_RDI;
  CVmRun *this_00;
  
  this_00 = in_RSI;
  strlen((char *)in_RSI);
  push_string(this_00,(char *)in_RSI,in_RDI);
  return;
}

Assistant:

void push_string(VMG_ const char *str)
        { push_string(vmg_ str, strlen(str)); }